

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

void __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,uchar *ptr,size_t numElements)

{
  int local_38;
  size_t storageSize;
  ArrayBuffer<unsigned_char,_1UL,_1UL> tmp;
  size_t numElements_local;
  uchar *ptr_local;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *this_local;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  if (numElements != 0) {
    tmp.m_cap = numElements;
    ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)&storageSize,numElements);
    local_38 = (int)tmp.m_cap;
    ::deMemcpy((void *)storageSize,ptr,(long)local_38);
    swap(this,(ArrayBuffer<unsigned_char,_1UL,_1UL> *)&storageSize);
    ~ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)&storageSize);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const T* ptr, size_t numElements)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (numElements)
	{
		// create new buffer of wanted size, copy to it, and swap to it
		ArrayBuffer<T,Alignment,Stride> tmp(numElements);

		if (Stride == sizeof(T))
		{
			// tightly packed
			const size_t storageSize = sizeof(T) * numElements;
			deMemcpy(tmp.m_ptr, ptr, (int)storageSize);
		}
		else
		{
			// sparsely packed
			for (size_t ndx = 0; ndx < numElements; ++ndx)
				*tmp.getElementPtr(ndx) = ptr[ndx];
		}

		swap(tmp);
	}
}